

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcDerivedProfileDef_0087a358;
  *(undefined ***)&this->field_0xa0 = &PTR__IfcDerivedProfileDef_0087a3a8;
  *(undefined ***)&(this->super_IfcProfileDef).field_0x58 = &PTR__IfcDerivedProfileDef_0087a380;
  pcVar3 = (this->Label).ptr._M_dataplus._M_p;
  paVar2 = &(this->Label).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x87a3d0;
  *(undefined8 *)&this->field_0xa0 = 0x87a3f8;
  pcVar3 = (this->super_IfcProfileDef).ProfileName.ptr._M_dataplus._M_p;
  paVar2 = &(this->super_IfcProfileDef).ProfileName.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcProfileDef).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10;
  puVar1 = &(this->super_IfcProfileDef).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  if (puVar4 != puVar1) {
    operator_delete(puVar4,*(long *)puVar1 + 1);
  }
  operator_delete(this,0xb8);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}